

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int archive_read_set_callback_data2(archive *_a,void *client_data,uint iindex)

{
  undefined4 *puVar1;
  long lVar2;
  int iVar3;
  void *pvVar4;
  char *fmt;
  
  iVar3 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_set_callback_data2");
  if (iVar3 == -0x1e) {
    return -0x1e;
  }
  iVar3 = _a[2].archive_format;
  if (_a[2].archive_format == 0) {
    pvVar4 = calloc(1,0x18);
    *(void **)&_a[2].compression_code = pvVar4;
    if (pvVar4 == (void *)0x0) {
      fmt = "No memory.";
      iVar3 = 0xc;
      goto LAB_003c4682;
    }
    _a[2].archive_format = 1;
    iVar3 = 1;
  }
  if (iindex <= iVar3 - 1U) {
    lVar2 = *(long *)&_a[2].compression_code;
    *(void **)(lVar2 + 0x10 + (ulong)iindex * 0x18) = client_data;
    puVar1 = (undefined4 *)(lVar2 + (ulong)iindex * 0x18);
    *puVar1 = 0xffffffff;
    puVar1[1] = 0xffffffff;
    puVar1[2] = 0xffffffff;
    puVar1[3] = 0xffffffff;
    return 0;
  }
  fmt = "Invalid index specified.";
  iVar3 = 0x16;
LAB_003c4682:
  archive_set_error(_a,iVar3,fmt);
  return -0x1e;
}

Assistant:

int
archive_read_set_callback_data2(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_set_callback_data2");

	if (a->client.nodes == 0)
	{
		a->client.dataset = (struct archive_read_data_node *)
		    calloc(1, sizeof(*a->client.dataset));
		if (a->client.dataset == NULL)
		{
			archive_set_error(&a->archive, ENOMEM,
				"No memory.");
			return ARCHIVE_FATAL;
		}
		a->client.nodes = 1;
	}

	if (iindex > a->client.nodes - 1)
	{
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}